

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest.hpp
# Opt level: O3

void __thiscall iutest::UnitTestSource::Initialize(UnitTestSource *this)

{
  UnitTest *pUVar1;
  
  pUVar1 = UnitTest::instance();
  pUVar1->m_init_iutest_count = pUVar1->m_init_iutest_count + 1;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::_M_erase_at_end
            (&(pUVar1->super_UnitTestImpl).m_ad_hoc_testresult.m_test_part_results,
             (pUVar1->super_UnitTestImpl).m_ad_hoc_testresult.m_test_part_results.
             super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>.
             _M_impl.super__Vector_impl_data._M_start);
  std::vector<iutest::TestProperty,_std::allocator<iutest::TestProperty>_>::_M_erase_at_end
            (&(pUVar1->super_UnitTestImpl).m_ad_hoc_testresult.m_test_propertys,
             (pUVar1->super_UnitTestImpl).m_ad_hoc_testresult.m_test_propertys.
             super__Vector_base<iutest::TestProperty,_std::allocator<iutest::TestProperty>_>._M_impl
             .super__Vector_impl_data._M_start);
  (pUVar1->super_UnitTestImpl).m_ad_hoc_testresult.m_elapsedmsec = 0;
  if ((detail::IFileSystem::GetInstanceVariable()::v == 0) &&
     (UnitTest::Initialize()::filesystem == '\0')) {
    Initialize();
  }
  if (pUVar1->m_init_iutest_count == 1) {
    detail::ParamTestSuiteHolder::RegisterTests(&pUVar1->m_param_testsuite_holder);
    return;
  }
  return;
}

Assistant:

void Initialize()
    {
        UnitTest::instance().Initialize();
    }